

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_utf8_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uchar *zTerm;
  int c;
  uchar *zIn;
  int nByte;
  
  if (0 < nArg) {
    zIn = (uchar *)jx9_value_to_string(*apArg,&nByte);
    if (0 < (long)nByte) {
      zTerm = zIn + nByte;
      while( true ) {
        if (zTerm <= zIn) {
          return 0;
        }
        c = jx9Utf8Read(zIn,zTerm,&zIn);
        if (c == 0) break;
        jx9_result_string(pCtx,(char *)&c,1);
      }
      return 0;
    }
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int vm_builtin_utf8_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nByte, c;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = (const unsigned char *)jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zEnd = &zIn[nByte];
	/* Start the decoding process */
	while( zIn < zEnd ){
		c = jx9Utf8Read(zIn, zEnd, &zIn);
		if( c == 0x0 ){
			break;
		}
		jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
	}
	return JX9_OK;
}